

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

void canvas_applybinbuf(_glist *x,_binbuf *b)

{
  _class **pp_Var1;
  _class **pp_Var2;
  _class **pp_Var3;
  t_symbol *ptVar4;
  
  ptVar4 = gensym("#A");
  pp_Var3 = s__X.s_thing;
  pp_Var2 = s__N.s_thing;
  pp_Var1 = ptVar4->s_thing;
  ptVar4->s_thing = (_class **)0x0;
  s__N.s_thing = &pd_canvasmaker;
  s__X.s_thing = (_class **)x;
  binbuf_eval(b,(t_pd *)0x0,0,(t_atom *)0x0);
  ptVar4->s_thing = pp_Var1;
  s__X.s_thing = pp_Var3;
  s__N.s_thing = pp_Var2;
  return;
}

Assistant:

static void canvas_applybinbuf(t_canvas *x, t_binbuf *b)
{
    t_symbol*asym = gensym("#A");
    t_pd *boundx = s__X.s_thing,
        *bounda = asym->s_thing,
        *boundn = s__N.s_thing;

    asym->s_thing = 0;
    s__X.s_thing = &x->gl_pd;
    s__N.s_thing = &pd_canvasmaker;

    binbuf_eval(b, 0, 0, 0);

    asym->s_thing = bounda;
    s__X.s_thing = boundx;
    s__N.s_thing = boundn;
}